

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativesum.cpp
# Opt level: O0

int __thiscall
ncnn::CumulativeSum::forward_inplace(CumulativeSum *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long *in_RSI;
  long lVar9;
  long in_RDI;
  int k_4;
  float *ptr_2;
  int i_5;
  Mat this_channel_1;
  int q_1;
  int c_2;
  int h_4;
  int w_5;
  int k_3;
  float *this_row_1;
  float *prev_row_1;
  int i_4;
  Mat this_channel;
  int q;
  int c_1;
  int h_3;
  int w_4;
  int k_2;
  float *cur;
  float *prev;
  int i_3;
  int size;
  int c;
  int h_2;
  int w_3;
  int k_1;
  float *ptr_1;
  int i_2;
  int h_1;
  int w_2;
  int k;
  float *this_row;
  float *prev_row;
  int i_1;
  int h;
  int w_1;
  int i;
  float *ptr;
  int w;
  int positive_axis;
  int dims;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int local_5ac;
  int local_59c;
  int local_58c;
  int local_53c;
  int local_52c;
  int local_514;
  int local_4c4;
  int local_4b4;
  int local_400;
  int local_3ec;
  int local_3e0;
  int local_3d4;
  int local_3c0;
  int local_3b4;
  int local_37c;
  
  iVar1 = (int)in_RSI[5];
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_5ac = iVar1 + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_5ac = *(int *)(in_RDI + 0xd0);
  }
  if (iVar1 == 1) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = *in_RSI;
    for (local_3b4 = 1; local_3b4 < iVar1; local_3b4 = local_3b4 + 1) {
      *(float *)(lVar3 + (long)local_3b4 * 4) =
           *(float *)(lVar3 + (long)local_3b4 * 4) + *(float *)(lVar3 + (long)(local_3b4 + -1) * 4);
    }
    local_37c = 0;
  }
  else if ((iVar1 == 2) && (local_5ac == 0)) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = in_RSI[6];
    for (local_3c0 = 1; local_3c0 < (int)lVar3; local_3c0 = local_3c0 + 1) {
      lVar6 = *in_RSI;
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar4 = in_RSI[2];
      lVar5 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_3c0 * in_RSI[2];
      for (local_3d4 = 0; local_3d4 < iVar1; local_3d4 = local_3d4 + 1) {
        *(float *)(lVar5 + (long)local_3d4 * 4) =
             *(float *)(lVar5 + (long)local_3d4 * 4) +
             *(float *)(lVar6 + (long)iVar2 * (long)(local_3c0 + -1) * lVar4 + (long)local_3d4 * 4);
      }
    }
    local_37c = 0;
  }
  else if ((iVar1 == 2) && (local_5ac == 1)) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = in_RSI[6];
    for (local_3e0 = 0; local_3e0 < (int)lVar3; local_3e0 = local_3e0 + 1) {
      lVar6 = *in_RSI + (long)*(int *)((long)in_RSI + 0x2c) * (long)local_3e0 * in_RSI[2];
      for (local_3ec = 1; local_3ec < iVar1; local_3ec = local_3ec + 1) {
        *(float *)(lVar6 + (long)local_3ec * 4) =
             *(float *)(lVar6 + (long)local_3ec * 4) +
             *(float *)(lVar6 + (long)(local_3ec + -1) * 4);
      }
    }
    local_37c = 0;
  }
  else if ((iVar1 == 3) && (local_5ac == 0)) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = in_RSI[6];
    lVar6 = in_RSI[7];
    for (local_400 = 1; local_400 < (int)lVar6; local_400 = local_400 + 1) {
      lVar4 = *in_RSI;
      lVar5 = in_RSI[8];
      lVar7 = in_RSI[2];
      lVar9 = *in_RSI + in_RSI[8] * (long)local_400 * in_RSI[2];
      for (local_4b4 = 0; local_4b4 < iVar1 * (int)lVar3; local_4b4 = local_4b4 + 1) {
        *(float *)(lVar9 + (long)local_4b4 * 4) =
             *(float *)(lVar9 + (long)local_4b4 * 4) +
             *(float *)(lVar4 + lVar5 * (local_400 + -1) * lVar7 + (long)local_4b4 * 4);
      }
    }
    local_37c = 0;
  }
  else if ((iVar1 == 3) && (local_5ac == 1)) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = in_RSI[6];
    lVar6 = in_RSI[7];
    for (local_4c4 = 0; local_4c4 < (int)lVar6; local_4c4 = local_4c4 + 1) {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar5 = *in_RSI + in_RSI[8] * (long)local_4c4 * in_RSI[2];
      lVar4 = in_RSI[2];
      for (local_514 = 1; local_514 < (int)lVar3; local_514 = local_514 + 1) {
        lVar7 = lVar5 + (long)iVar2 * (long)local_514 * lVar4;
        for (local_52c = 0; local_52c < iVar1; local_52c = local_52c + 1) {
          *(float *)(lVar7 + (long)local_52c * 4) =
               *(float *)(lVar7 + (long)local_52c * 4) +
               *(float *)(lVar5 + (long)iVar2 * (long)(local_514 + -1) * lVar4 + (long)local_52c * 4
                         );
        }
      }
    }
    local_37c = 0;
  }
  else if ((iVar1 == 3) && (local_5ac == 2)) {
    iVar1 = *(int *)((long)in_RSI + 0x2c);
    lVar3 = in_RSI[6];
    lVar6 = in_RSI[7];
    for (local_53c = 0; local_53c < (int)lVar6; local_53c = local_53c + 1) {
      iVar2 = *(int *)((long)in_RSI + 0x2c);
      lVar4 = *in_RSI;
      lVar5 = in_RSI[8];
      lVar7 = in_RSI[2];
      lVar9 = in_RSI[2];
      for (local_58c = 0; local_58c < (int)lVar3; local_58c = local_58c + 1) {
        lVar8 = lVar4 + lVar5 * local_53c * lVar7 + (long)iVar2 * (long)local_58c * lVar9;
        for (local_59c = 1; local_59c < iVar1; local_59c = local_59c + 1) {
          *(float *)(lVar8 + (long)local_59c * 4) =
               *(float *)(lVar8 + (long)local_59c * 4) +
               *(float *)(lVar8 + (long)(local_59c + -1) * 4);
        }
      }
    }
    local_37c = 0;
  }
  else {
    local_37c = -100;
  }
  return local_37c;
}

Assistant:

int CumulativeSum::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        for (int i = 1; i < w; ++i)
        {
            ptr[i] = ptr[i] + ptr[i - 1];
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        // sum over rows
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i = 1; i < h; ++i)
        {
            const float* prev_row = bottom_top_blob.row(i - 1);
            float* this_row = bottom_top_blob.row(i);

            for (int k = 0; k < w; ++k)
            {
                this_row[k] = this_row[k] + prev_row[k];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        // sum over columns
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; ++i)
        {
            float* ptr = bottom_top_blob.row(i);

            for (int k = 1; k < w; ++k)
            {
                ptr[k] = ptr[k] + ptr[k - 1];
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        // sum over channels
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        int size = w * h;

        for (int i = 1; i < c; ++i)
        {
            const float* prev = bottom_top_blob.channel(i - 1);
            float* cur = bottom_top_blob.channel(i);

            for (int k = 0; k < size; ++k)
            {
                cur[k] = cur[k] + prev[k];
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 0)

    if (dims == 3 && positive_axis == 1)
    {
        // sum over rows within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 1; i < h; ++i)
            {
                const float* prev_row = this_channel.row(i - 1);
                float* this_row = this_channel.row(i);

                for (int k = 0; k < w; ++k)
                {
                    this_row[k] = this_row[k] + prev_row[k];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        // sum over columns within each channel

        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int c = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            Mat this_channel = bottom_top_blob.channel(q);

            for (int i = 0; i < h; ++i)
            {
                float* ptr = this_channel.row(i);
                for (int k = 1; k < w; ++k)
                {
                    ptr[k] = ptr[k] + ptr[k - 1];
                }
            }
        }

        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}